

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

void * mfsteal(mFILE *mf,size_t *size_out)

{
  void *data;
  size_t *size_out_local;
  mFILE *mf_local;
  
  if (mf == (mFILE *)0x0) {
    mf_local = (mFILE *)0x0;
  }
  else {
    mf_local = (mFILE *)mf->data;
    if (size_out != (size_t *)0x0) {
      *size_out = mf->size;
    }
    mfdetach(mf);
    mf->data = (char *)0x0;
    mfdestroy(mf);
  }
  return mf_local;
}

Assistant:

void *mfsteal(mFILE *mf, size_t *size_out) {
    void *data;

    if (!mf) return NULL;

    data = mf->data;
    
    if (NULL != size_out) *size_out = mf->size;

    mfdetach(mf);
    mf->data = NULL;
    mfdestroy(mf);

    return data;
}